

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.h
# Opt level: O0

object_task<crnlib::dxt_image> * __thiscall
crnlib::
crnlib_new<crnlib::object_task<crnlib::dxt_image>,crnlib::dxt_image*,void(crnlib::dxt_image::*)(unsigned_long_long,void*),crnlib::object_task_flags>
          (dxt_image **init0,offset_in_dxt_image_to_subr *init1,object_task_flags *init2)

{
  object_task<crnlib::dxt_image> *poVar1;
  dxt_image *in_RDX;
  object_task<crnlib::dxt_image> *in_RSI;
  object_task<crnlib::dxt_image> *p;
  
  poVar1 = (object_task<crnlib::dxt_image> *)crnlib_malloc(0x21c75d);
  object_task<crnlib::dxt_image>::object_task
            (in_RSI,in_RDX,(object_method_ptr)in_RSI->m_pObject,
             (uint)((ulong)(in_RSI->super_executable_task)._vptr_executable_task >> 0x20));
  return poVar1;
}

Assistant:

inline T* crnlib_new(const A& init0, const B& init1, const C& init2) {
  T* p = static_cast<T*>(crnlib_malloc(sizeof(T)));
  return new (static_cast<void*>(p)) T(init0, init1, init2);
}